

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.h
# Opt level: O0

VoidType * __thiscall psy::C::DeclarationBinder::makeType<psy::C::VoidType>(DeclarationBinder *this)

{
  SemanticModel *this_00;
  VoidType *this_01;
  Type *pTVar1;
  unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_> local_30 [3];
  unique_ptr<psy::C::VoidType,_std::default_delete<psy::C::VoidType>_> local_18;
  unique_ptr<psy::C::VoidType,_std::default_delete<psy::C::VoidType>_> ty;
  DeclarationBinder *this_local;
  
  ty._M_t.super___uniq_ptr_impl<psy::C::VoidType,_std::default_delete<psy::C::VoidType>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::VoidType_*,_std::default_delete<psy::C::VoidType>_>.
  super__Head_base<0UL,_psy::C::VoidType_*,_false>._M_head_impl =
       (__uniq_ptr_data<psy::C::VoidType,_std::default_delete<psy::C::VoidType>,_true,_true>)
       (__uniq_ptr_data<psy::C::VoidType,_std::default_delete<psy::C::VoidType>,_true,_true>)this;
  this_01 = (VoidType *)operator_new(0x10);
  VoidType::VoidType(this_01);
  std::unique_ptr<psy::C::VoidType,std::default_delete<psy::C::VoidType>>::
  unique_ptr<std::default_delete<psy::C::VoidType>,void>
            ((unique_ptr<psy::C::VoidType,std::default_delete<psy::C::VoidType>> *)&local_18,this_01
            );
  this_00 = this->semaModel_;
  std::unique_ptr<psy::C::Type,std::default_delete<psy::C::Type>>::
  unique_ptr<psy::C::VoidType,std::default_delete<psy::C::VoidType>,void>
            ((unique_ptr<psy::C::Type,std::default_delete<psy::C::Type>> *)local_30,&local_18);
  pTVar1 = SemanticModel::keepType(this_00,local_30);
  std::unique_ptr<psy::C::Type,_std::default_delete<psy::C::Type>_>::~unique_ptr(local_30);
  std::unique_ptr<psy::C::VoidType,_std::default_delete<psy::C::VoidType>_>::~unique_ptr(&local_18);
  return (VoidType *)pTVar1;
}

Assistant:

TyT* DeclarationBinder::makeType(TyTArgs... args)
{
    std::unique_ptr<TyT> ty(new TyT(std::forward<TyTArgs>(args)...));
    return static_cast<TyT*>(semaModel_->keepType(std::move(ty)));
}